

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall HFSubConsumer::~HFSubConsumer(HFSubConsumer *this)

{
  bool bVar1;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *pCVar2;
  undefined8 *in_RDI;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *in_stack_00000010;
  zframe_t *frame;
  size_t i;
  _zframe_t **in_stack_00000048;
  consumer_token_t *in_stack_00000050;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *in_stack_00000058;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *this_00;
  zframe_t *local_18;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *local_10;
  
  *in_RDI = &PTR__HFSubConsumer_005d5e38;
  if (in_RDI[0x70] != 0) {
    zsock_destroy_checked
              ((zsock_t **)(in_RDI + 0x70),
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
               ,0xa3);
  }
  local_10 = (ConcurrentQueue<_zframe_t_*,_MyTraits> *)0x0;
  while (this_00 = local_10,
        pCVar2 = (ConcurrentQueue<_zframe_t_*,_MyTraits> *)
                 moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::size_approx(local_10),
        this_00 < pCVar2) {
    bVar1 = moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
                      (in_stack_00000058,in_stack_00000050,in_stack_00000048);
    if (bVar1) {
      zframe_destroy(&local_18);
    }
    local_10 = (ConcurrentQueue<_zframe_t_*,_MyTraits> *)
               ((long)&(local_10->producerListTail)._M_b._M_p + 1);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0x72));
  moodycamel::ProducerToken::~ProducerToken((ProducerToken *)this_00);
  moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::~ConcurrentQueue(in_stack_00000010);
  HighFreqSub::~HighFreqSub((HighFreqSub *)this_00);
  return;
}

Assistant:

HFSubConsumer::~HFSubConsumer(){
    if(req)
        zsock_destroy(&req);
    for(size_t i = 0; i < framequeue.size_approx(); i++){
        zframe_t* frame;
        if(framequeue.try_dequeue(consumetoken,frame))
            zframe_destroy(&frame);
    }
}